

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool __thiscall
tinyusdz::GeomPrimvar::get_value<std::vector<bool,std::allocator<bool>>>
          (GeomPrimvar *this,vector<bool,_std::allocator<bool>_> *dest,string *err)

{
  bool bVar1;
  uint32_t tyid;
  value_type *__x;
  PrimVar *this_00;
  TimeSamples *this_01;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *this_02;
  const_reference pvVar2;
  vector<bool,_std::allocator<bool>_> *__x_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  vector<bool,_std::allocator<bool>_> *pv_1;
  TimeSamples *ts;
  undefined1 local_140 [8];
  string local_138 [32];
  string local_118;
  undefined4 local_f4;
  optional<std::vector<bool,_std::allocator<bool>_>_> local_f0;
  undefined1 local_c0 [8];
  optional<std::vector<bool,_std::allocator<bool>_>_> pv;
  allocator local_69;
  string local_68 [32];
  string local_48;
  string *local_28;
  string *err_local;
  vector<bool,_std::allocator<bool>_> *dest_local;
  GeomPrimvar *this_local;
  
  local_28 = err;
  err_local = (string *)dest;
  dest_local = (vector<bool,_std::allocator<bool>_> *)this;
  if (dest == (vector<bool,_std::allocator<bool>_> *)0x0) {
    if (err != (string *)0x0) {
      std::__cxx11::string::operator+=((string *)err,"Output value is nullptr.");
    }
    this_local._7_1_ = 0;
  }
  else {
    bVar1 = Attribute::is_blocked(&this->_attr);
    if (bVar1) {
      if (local_28 != (string *)0x0) {
        std::__cxx11::string::operator+=((string *)local_28,"Attribute is blocked.");
      }
      this_local._7_1_ = 0;
    }
    else {
      bVar1 = Attribute::has_value(&this->_attr);
      if (bVar1) {
        tyid = Attribute::type_id(&this->_attr);
        bVar1 = IsSupportedGeomPrimvarType(tyid);
        if (bVar1) {
          Attribute::get_value<std::vector<bool,std::allocator<bool>>>(&local_f0,&this->_attr);
          nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::
          optional<std::vector<bool,_std::allocator<bool>_>,_0>
                    ((optional<std::vector<bool,_std::allocator<bool>_>_> *)local_c0,&local_f0);
          nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional
                    (&local_f0);
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_c0);
          if (bVar1) {
            __x = nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::value
                            ((optional<std::vector<bool,_std::allocator<bool>_>_> *)local_c0);
            std::vector<bool,_std::allocator<bool>_>::operator=
                      ((vector<bool,_std::allocator<bool>_> *)err_local,__x);
            this_local._7_1_ = 1;
          }
          else {
            if (local_28 != (string *)0x0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_138,
                         "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                         ,(allocator *)(local_140 + 7));
              local_140._0_4_ =
                   tinyusdz::value::TypeTraits<std::vector<bool,_std::allocator<bool>_>_>::type_id()
              ;
              Attribute::type_name_abi_cxx11_((string *)&ts,&this->_attr);
              fmt::format<unsigned_int,std::__cxx11::string>
                        (&local_118,(fmt *)local_138,(string *)local_140,(uint *)&ts,in_R8);
              std::__cxx11::string::operator+=((string *)local_28,(string *)&local_118);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&ts);
              std::__cxx11::string::~string(local_138);
              std::allocator<char>::~allocator((allocator<char> *)(local_140 + 7));
            }
            this_local._7_1_ = 0;
          }
          local_f4 = 1;
          nonstd::optional_lite::optional<std::vector<bool,_std::allocator<bool>_>_>::~optional
                    ((optional<std::vector<bool,_std::allocator<bool>_>_> *)local_c0);
        }
        else {
          if (local_28 != (string *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_68,"Unsupported type for GeomPrimvar. type = `{}`",&local_69);
            Attribute::type_name_abi_cxx11_((string *)((long)&pv.contained + 0x20),&this->_attr);
            fmt::format<std::__cxx11::string>
                      (&local_48,(fmt *)local_68,(string *)((long)&pv.contained + 0x20),in_RCX);
            std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
            std::__cxx11::string::~string((string *)&local_48);
            std::__cxx11::string::~string((string *)((long)&pv.contained + 0x20));
            std::__cxx11::string::~string(local_68);
            std::allocator<char>::~allocator((allocator<char> *)&local_69);
          }
          this_local._7_1_ = 0;
        }
      }
      else {
        bVar1 = Attribute::has_timesamples(&this->_attr);
        if (bVar1) {
          this_00 = Attribute::get_var(&this->_attr);
          this_01 = primvar::PrimVar::ts_raw(this_00);
          bVar1 = tinyusdz::value::TimeSamples::empty(this_01);
          if (bVar1) {
            if (local_28 != (string *)0x0) {
              std::__cxx11::string::operator+=
                        ((string *)local_28,"No TimeSample value in Attribute..");
            }
            this_local._7_1_ = 0;
            goto LAB_00274333;
          }
          this_02 = tinyusdz::value::TimeSamples::get_samples(this_01);
          pvVar2 = std::
                   vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ::at(this_02,0);
          __x_00 = tinyusdz::value::Value::as<std::vector<bool,std::allocator<bool>>>
                             (&pvVar2->value,false);
          if (__x_00 != (vector<bool,_std::allocator<bool>_> *)0x0) {
            std::vector<bool,_std::allocator<bool>_>::operator=
                      ((vector<bool,_std::allocator<bool>_> *)err_local,__x_00);
            this_local._7_1_ = 1;
            goto LAB_00274333;
          }
        }
        this_local._7_1_ = 0;
      }
    }
  }
LAB_00274333:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}